

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O1

void duckdb::BitwiseOperation::
     Combine<duckdb::BitState<duckdb::string_t>,duckdb::BitStringAndOperation>
               (BitState<duckdb::string_t> *source,BitState<duckdb::string_t> *target,
               AggregateInputData *param_3)

{
  undefined4 uVar1;
  char *__src;
  char *__dest;
  anon_union_16_2_67f50693_for_value local_38;
  
  if (source->is_set == true) {
    local_38._0_8_ = *(undefined8 *)&(source->value).value;
    __src = (source->value).value.pointer.ptr;
    if (target->is_set == false) {
      if ((uint)local_38._0_8_ < 0xd) {
        *(undefined8 *)&(target->value).value = local_38._0_8_;
        __dest = __src;
      }
      else {
        __dest = (char *)operator_new__(local_38._0_8_ & 0xffffffff);
        switchD_00b1422a::default(__dest,__src,local_38._0_8_ & 0xffffffff);
        uVar1 = *(undefined4 *)__dest;
        (target->value).value.pointer.length = (uint)local_38._0_8_;
        *(undefined4 *)((long)&(target->value).value + 4) = uVar1;
      }
      (target->value).value.pointer.ptr = __dest;
      target->is_set = true;
    }
    else {
      local_38.pointer.ptr = __src;
      Bit::BitwiseAnd((bitstring_t *)&local_38.pointer,&target->value,&target->value);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}